

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clasp_options.cpp
# Opt level: O0

ArgString * __thiscall Potassco::ArgString::get<Clasp::MovingAvg::Type>(ArgString *this,Type *x)

{
  bool bVar1;
  int iVar2;
  undefined8 in_RSI;
  ArgString *in_RDI;
  Type *unaff_retaddr;
  char *in_stack_00000008;
  char *next;
  char *local_28;
  ArgString *errPos;
  
  iVar2 = (int)((ulong)in_RSI >> 0x20);
  errPos = in_RDI;
  bVar1 = ok(in_RDI);
  if (bVar1) {
    local_28 = in_RDI->in + (int)(uint)(*in_RDI->in == in_RDI->skip);
    iVar2 = Clasp::xconvert(in_stack_00000008,unaff_retaddr,&errPos->in,iVar2);
    if (iVar2 == 0) {
      local_28 = (char *)0x0;
    }
    in_RDI->in = local_28;
    in_RDI->skip = ',';
  }
  return in_RDI;
}

Assistant:

ArgString& get(T& x)  {
		if (ok()) {
			const char* next = in + (*in == skip);
			in = xconvert(next, x, &next, 0) != 0 ? next : 0;
			skip = ',';
		}
		return *this;
	}